

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hpp
# Opt level: O0

bool __thiscall
boost::pool<boost::default_user_allocator_new_delete>::purge_memory
          (pool<boost::default_user_allocator_new_delete> *this)

{
  bool bVar1;
  char **ppcVar2;
  undefined8 *in_RDI;
  PODptr<unsigned_long> next;
  PODptr<unsigned_long> iter;
  PODptr<unsigned_long> *this_00;
  PODptr<unsigned_long> local_30;
  size_type sStack_28;
  PODptr<unsigned_long> local_20;
  bool local_1;
  
  local_20.ptr = (char *)in_RDI[1];
  local_20.sz = in_RDI[2];
  bVar1 = details::PODptr<unsigned_long>::valid((PODptr<unsigned_long> *)0x27f67e);
  if (bVar1) {
    do {
      local_30 = details::PODptr<unsigned_long>::next(this_00);
      ppcVar2 = details::PODptr<unsigned_long>::begin(&local_20);
      default_user_allocator_new_delete::free(*ppcVar2);
      local_20.sz = sStack_28;
      local_20.ptr = (char *)this_00;
      bVar1 = details::PODptr<unsigned_long>::valid((PODptr<unsigned_long> *)0x27f6cf);
    } while (bVar1);
    details::PODptr<unsigned_long>::invalidate((PODptr<unsigned_long> *)0x27f6e0);
    *in_RDI = 0;
    in_RDI[4] = in_RDI[5];
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool pool<UserAllocator>::purge_memory()
{ //! pool must be ordered.
  //! Frees every memory block.
  //!
  //! This function invalidates any pointers previously returned
  //! by allocation functions of t.
  //! \returns true if at least one memory block was freed.

  details::PODptr<size_type> iter = list;

  if (!iter.valid())
    return false;

  do
  {
    // hold "next" pointer
    const details::PODptr<size_type> next = iter.next();

    // delete the storage
    (UserAllocator::free)(iter.begin());

    // increment iter
    iter = next;
  } while (iter.valid());

  list.invalidate();
  this->first = 0;
  next_size = start_size;

  return true;
}